

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_class_proto.h
# Opt level: O0

void dukglue::detail::ProtoManager::make_script_object<Shape>(duk_context *ctx,Shape *obj)

{
  Shape *pSVar1;
  Shape *ctx_00;
  type_index local_30;
  TypeInfo local_28;
  Shape *local_18;
  Shape *obj_local;
  duk_context *ctx_local;
  
  local_18 = obj;
  obj_local = (Shape *)ctx;
  if (obj != (Shape *)0x0) {
    duk_push_object(ctx);
    duk_push_pointer((duk_context *)obj_local,local_18);
    duk_put_prop_string((duk_context *)obj_local,-2,anon_var_dwarf_c456);
    ctx_00 = obj_local;
    pSVar1 = local_18;
    if (local_18 == (Shape *)0x0) {
      __cxa_bad_typeid();
    }
    std::type_index::type_index(&local_30,(type_info *)pSVar1->_vptr_Shape[-1]);
    TypeInfo::TypeInfo(&local_28,&local_30);
    push_prototype((duk_context *)ctx_00,&local_28);
    duk_set_prototype((duk_context *)obj_local,-2);
    return;
  }
  __assert_fail("obj != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_class_proto.h"
                ,0x37,
                "static void dukglue::detail::ProtoManager::make_script_object(duk_context *, Cls *) [Cls = Shape]"
               );
}

Assistant:

static void make_script_object(duk_context* ctx, Cls* obj)
			{
				assert(obj != NULL);

				duk_push_object(ctx);
				duk_push_pointer(ctx, obj);
				duk_put_prop_string(ctx, -2, "\xFF" "obj_ptr");

				// push the appropriate prototype
#ifdef DUKGLUE_INFER_BASE_CLASS
				// In the "infer base class" case, we push the prototype
				// corresponding to the compile-time class if no prototype
				// for the run-time type has been defined. This allows us to
				// skip calling dukglue_set_base_class() for every derived class,
				// so long as we:
				// (1) Always use the derived class as a pointer typed as the base class
				// (2) Do not create a prototype for the derived class
				//     (i.e. do not register any functions on the derived class).

				// For big projects with hundreds of derived classes, this is preferrable
				// to registering each type's base class individually. However,
				// registering a native method on a derived class will cause the
				// base class's methods to disappear until dukglue_set_base_class() is
				// also called (because registering the native method causes a prototype
				// to be created for the run-time type). This behavior may be unexpected,
				// and for "small" projects it is reasonable to require
				// dukglue_set_base_class() to be called, so it is opt-in via an ifdef.

				// does a prototype exist for the run-time type? if so, push it
				if (!find_and_push_prototype(ctx, TypeInfo(typeid(*obj)))) {
					// nope, find or create the prototype for the compile-time type
					// and push that
					push_prototype<Cls>(ctx);
				}
#else
				// always use the prototype for the run-time type
				push_prototype(ctx, TypeInfo(typeid(*obj)));
#endif

				duk_set_prototype(ctx, -2);
			}